

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_flag_synonym(parser *p)

{
  long lVar1;
  wchar_t wVar2;
  int iVar3;
  parser_error pVar4;
  long *plVar5;
  char *code;
  
  plVar5 = (long *)parser_priv(p);
  code = parser_getsym(p,"code");
  wVar2 = parser_getint(p,"exact");
  if (code == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = code_index_in_array(obj_flags,code);
  }
  if (plVar5 != (long *)0x0) {
    lVar1 = *plVar5;
    if (lVar1 == 0) {
      pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else if (iVar3 < 1) {
      pVar4 = PARSE_ERROR_INVALID_OBJ_PROP_CODE;
    }
    else {
      *(int *)(lVar1 + 0x60) = iVar3;
      *(bool *)(lVar1 + 100) = wVar2 != L'\0';
      pVar4 = PARSE_ERROR_NONE;
    }
    return pVar4;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x19f,"enum parser_error parse_player_timed_flag_synonym(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_flag_synonym(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *code = parser_getsym(p, "code");
	bool is_exact = parser_getint(p, "exact") != 0;
	int idx = (code) ? code_index_in_array(obj_flags, code) : OF_NONE;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (idx <= OF_NONE) {
		return PARSE_ERROR_INVALID_OBJ_PROP_CODE;
	}
	ps->t->oflag_dup = idx;
	ps->t->oflag_syn = is_exact;
	return PARSE_ERROR_NONE;
}